

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubDVertex::ClearEdgeMarks(ON_SubDVertex *this)

{
  bool bVar1;
  ulong uVar2;
  unsigned_short vei;
  ulong uVar3;
  
  bVar1 = true;
  for (uVar3 = 0; uVar3 < this->m_edge_count; uVar3 = uVar3 + 1) {
    uVar2 = this->m_edges[uVar3].m_ptr & 0xfffffffffffffff8;
    if (uVar2 == 0) {
      bVar1 = false;
    }
    else {
      ON_ComponentStatus::ClearRuntimeMark((ON_ComponentStatus *)(uVar2 + 0x10));
    }
  }
  return bVar1;
}

Assistant:

bool ON_SubDVertex::ClearEdgeMarks() const
{
  bool rc = true;
  for (unsigned short vei = 0; vei < m_edge_count; ++vei)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr == e)
      rc = false;
    else
      e->m_status.ClearRuntimeMark();
  }
  return rc;
}